

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

void __thiscall
BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparseNode<Memory::JitArenaAllocator> *node2)

{
  bool bVar1;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  BVSparseNode *newNode;
  BVSparse<Memory::JitArenaAllocator> *local_28;
  Type *prevNextField;
  BVSparseNode *node1;
  BVSparseNode<Memory::JitArenaAllocator> *node2_local;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  prevNextField = &this->head->next;
  this->lastFoundIndex = (Type_conflict)0x0;
  local_28 = this;
  for (node1 = node2; prevNextField != (Type *)0x0 && node1 != (BVSparseNode *)0x0;
      node1 = node1->next) {
    bVar1 = BVUnitT<unsigned_long>::IsEmpty(&node1->data);
    if (!bVar1) {
      *(Type *)(prevNextField + 1) = node1->startIndex;
      BVUnitT<unsigned_long>::Copy
                ((BVUnitT<unsigned_long> *)(prevNextField + 2),
                 (BVUnitT<unsigned_long>)(node1->data).word);
      local_28 = (BVSparse<Memory::JitArenaAllocator> *)prevNextField;
      prevNextField = &(*prevNextField)->next;
    }
  }
  if (prevNextField == (Type *)0x0) {
    for (; node1 != (BVSparseNode *)0x0; node1 = node1->next) {
      bVar1 = BVUnitT<unsigned_long>::IsEmpty(&node1->data);
      if (!bVar1) {
        pBVar2 = (BVSparse<Memory::JitArenaAllocator> *)
                 Allocate(this,node1->startIndex,(BVSparseNode *)0x0);
        BVUnitT<unsigned_long>::Copy
                  ((Type *)&pBVar2->alloc,(BVUnitT<unsigned_long>)(node1->data).word);
        local_28->head = (Type_conflict)pBVar2;
        local_28 = pBVar2;
      }
    }
  }
  else {
    for (; prevNextField != (Type *)0x0;
        prevNextField = &DeleteNode(this,(BVSparseNode *)prevNextField,true)->next) {
    }
    local_28->head = (Type)0x0;
  }
  return;
}

Assistant:

void
BVSparse<TAllocator>::CopyFromNode(const ::BVSparseNode<TSrcAllocator> * node2)
{
    BVSparseNode * node1 = this->head;
    Field(BVSparseNode*, TAllocator)* prevNextField = &this->head;
    this->lastFoundIndex = nullptr;

    while (node1 != nullptr && node2 != nullptr)
    {
        if (!node2->data.IsEmpty())
        {
            node1->startIndex = node2->startIndex;
            node1->data.Copy(node2->data);
            prevNextField = &node1->next;
            node1 = node1->next;
        }

        node2 = node2->next;
    }

    if (node1 != nullptr)
    {
        while (node1 != nullptr)
        {
            node1 = this->DeleteNode(node1);
        }
        *prevNextField = nullptr;
    }
    else
    {
        while (node2 != nullptr)
        {
            if (!node2->data.IsEmpty())
            {
                BVSparseNode * newNode = Allocate(node2->startIndex, nullptr);
                newNode->data.Copy(node2->data);
                *prevNextField = newNode;
                prevNextField = &newNode->next;
            }
            node2 = node2->next;
        }
    }
}